

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall Loop::IsSymAssignedToInSelfOrParents(Loop *this,StackSym *sym)

{
  BVIndex i;
  BOOLEAN BVar1;
  Loop *curLoop;
  bool bVar2;
  
  i = (sym->super_Sym).m_id;
  BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(this->symsAssignedToInLoop,i);
  bVar2 = true;
  while( true ) {
    if (BVar1 != '\0') {
      return bVar2;
    }
    this = this->parent;
    bVar2 = this != (Loop *)0x0;
    if (this == (Loop *)0x0) break;
    BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(this->symsAssignedToInLoop,i);
  }
  return bVar2;
}

Assistant:

bool
Loop::IsSymAssignedToInSelfOrParents(StackSym * const sym) const
{
    return IsSymAssignedToInSelfOrParents(sym->m_id);
}